

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_sid.cpp
# Opt level: O1

string * __thiscall
cppcms::sessions::session_sid::get_new_sid_abi_cxx11_
          (string *__return_storage_ptr__,session_sid *this)

{
  byte bVar1;
  long lVar2;
  size_t sVar3;
  urandom_device rnd;
  char res [33];
  char sid [16];
  urandom_device local_60;
  char local_58 [48];
  byte local_28 [24];
  
  urandom_device::urandom_device(&local_60);
  urandom_device::generate(&local_60,local_28,0x10);
  lVar2 = 0;
  do {
    bVar1 = local_28[lVar2];
    local_58[lVar2 * 2] = "0123456789abcdef"[bVar1 >> 4];
    local_58[lVar2 * 2 + 1] = "0123456789abcdef"[bVar1 & 0xf];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  local_58[0x20] = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar3 = strlen(local_58);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_58,local_58 + sVar3);
  urandom_device::~urandom_device(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string session_sid::get_new_sid()
{
	char sid[16];			
	char res[33];
	urandom_device rnd;
	rnd.generate(sid,sizeof(sid));
	cppcms::impl::tohex(sid,sizeof(sid),res);
	return res;
}